

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_ppt_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  uint uVar1;
  opj_tcp_v2_t *poVar2;
  undefined8 in_RAX;
  OPJ_BYTE *pOVar3;
  char *fmt;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  OPJ_UINT32 l_Z_ppt;
  OPJ_UINT32 local_34;
  
  local_34 = (OPJ_UINT32)((ulong)in_RAX >> 0x20);
  if (p_header_size == 0) {
    fmt = "Error reading PPT marker\n";
  }
  else if (((p_j2k->m_cp).field_0x88 & 1) == 0) {
    poVar2 = (p_j2k->m_cp).tcps;
    uVar1 = p_j2k->m_current_tile_number;
    poVar2[uVar1].field_0x1628 = poVar2[uVar1].field_0x1628 | 1;
    opj_read_bytes_LE(p_header_data,&local_34,1);
    uVar4 = p_header_size - 1;
    if (local_34 == 0) {
      poVar2[uVar1].ppt_data_size = 0;
      poVar2[uVar1].ppt_len = uVar4;
      pOVar3 = (OPJ_BYTE *)calloc((ulong)uVar4,1);
      poVar2[uVar1].ppt_buffer = pOVar3;
      if (pOVar3 != (OPJ_BYTE *)0x0) {
        poVar2[uVar1].ppt_data = pOVar3;
        uVar6 = 0;
        goto LAB_001231e9;
      }
    }
    else {
      uVar5 = poVar2[uVar1].ppt_len + uVar4;
      poVar2[uVar1].ppt_len = uVar5;
      pOVar3 = (OPJ_BYTE *)realloc(poVar2[uVar1].ppt_buffer,(ulong)uVar5);
      poVar2[uVar1].ppt_buffer = pOVar3;
      if (pOVar3 != (OPJ_BYTE *)0x0) {
        poVar2[uVar1].ppt_data = pOVar3;
        uVar6 = (ulong)poVar2[uVar1].ppt_data_size;
        memset(pOVar3 + uVar6,0,(ulong)uVar4);
LAB_001231e9:
        memcpy(pOVar3 + uVar6,p_header_data + 1,(ulong)uVar4);
        poVar2[uVar1].ppt_data_size = uVar4 + (int)uVar6;
        return 1;
      }
    }
    fmt = "Not enough memory reading PPT marker\n";
  }
  else {
    fmt = 
    "Error reading PPT marker: packet header have been previously found in the main header (PPM marker).\n"
    ;
  }
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

opj_bool j2k_read_ppt_v2 (	opj_j2k_v2_t *p_j2k,
							OPJ_BYTE * p_header_data,
							OPJ_UINT32 p_header_size,
							struct opj_event_mgr * p_manager )
{
	opj_cp_v2_t *l_cp = 00;
	opj_tcp_v2_t *l_tcp = 00;
	OPJ_UINT32 l_Z_ppt;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	/* We need to have the Z_ppt element at minimum */
	if (p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading PPT marker\n");
		return OPJ_FALSE;
	}

	l_cp = &(p_j2k->m_cp);
	if (l_cp->ppm){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading PPT marker: packet header have been previously found in the main header (PPM marker).\n");
		return OPJ_FALSE;
	}

	l_tcp = &(l_cp->tcps[p_j2k->m_current_tile_number]);
	l_tcp->ppt = 1;

	opj_read_bytes(p_header_data,&l_Z_ppt,1);		/* Z_ppt */
	++p_header_data;
	--p_header_size;

	/* Allocate buffer to read the packet header */
	if (l_Z_ppt == 0) {
		/* First PPT marker */
		l_tcp->ppt_data_size = 0;
		l_tcp->ppt_len = p_header_size;

		l_tcp->ppt_buffer = (OPJ_BYTE *) opj_calloc(l_tcp->ppt_len, sizeof(OPJ_BYTE) );
		if (l_tcp->ppt_buffer == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory reading PPT marker\n");
			return OPJ_FALSE;
		}
		l_tcp->ppt_data = l_tcp->ppt_buffer;

		/* memset(l_tcp->ppt_buffer,0,l_tcp->ppt_len); */
	}
	else {
		l_tcp->ppt_len += p_header_size;

		l_tcp->ppt_buffer = (OPJ_BYTE *) opj_realloc(l_tcp->ppt_buffer,l_tcp->ppt_len);
		if (l_tcp->ppt_buffer == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory reading PPT marker\n");
			return OPJ_FALSE;
		}
		l_tcp->ppt_data = l_tcp->ppt_buffer;

		memset(l_tcp->ppt_buffer+l_tcp->ppt_data_size,0,p_header_size);
	}

	/* Read packet header from buffer */
	memcpy(l_tcp->ppt_buffer+l_tcp->ppt_data_size,p_header_data,p_header_size);

	l_tcp->ppt_data_size += p_header_size;

	return OPJ_TRUE;
}